

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O2

uint lodepng_encode(uchar **out,size_t *outsize,uchar *image,uint w,uint h,LodePNGState *state)

{
  LodePNGEncoderSettings *settings;
  LodePNGColorMode *pLVar1;
  uchar uVar2;
  char *pcVar3;
  byte bVar4;
  bool bVar8;
  bool bVar9;
  char **ppcVar10;
  uint uVar11;
  int iVar12;
  LodePNGColorType LVar13;
  uchar *puVar14;
  size_t sVar15;
  size_t sVar16;
  uchar uVar17;
  uchar uVar18;
  uchar uVar19;
  uint b;
  size_t sVar20;
  uchar *puVar21;
  uint *puVar22;
  ulong uVar23;
  long lVar24;
  uchar *in;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  size_t local_1d8;
  ucvector bKGD;
  ucvector outv;
  uchar *data;
  undefined1 local_168 [16];
  undefined8 local_158;
  size_t local_150;
  uchar *local_148;
  size_t datasize;
  char **local_138;
  char **local_130;
  char **local_128;
  char **local_120;
  LodePNGInfo info;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  
  data = (uchar *)0x0;
  datasize = 0;
  *out = (uchar *)0x0;
  *outsize = 0;
  state->error = 0;
  LVar13 = (state->info_png).color.colortype;
  if (((LVar13 == LCT_PALETTE) || ((state->encoder).force_palette != 0)) &&
     ((state->info_png).color.palettesize - 0x101 < 0xffffffffffffff00)) {
    state->error = 0x44;
    return 0x44;
  }
  if (2 < (state->encoder).zlibsettings.btype) {
    state->error = 0x3d;
    return 0x3d;
  }
  if (1 < (state->info_png).interlace_method) {
    state->error = 0x47;
    return 0x47;
  }
  uVar11 = checkColorValidity(LVar13,(state->info_png).color.bitdepth);
  state->error = uVar11;
  if (uVar11 != 0) {
    return uVar11;
  }
  uVar11 = checkColorValidity((state->info_raw).colortype,(state->info_raw).bitdepth);
  state->error = uVar11;
  if (uVar11 != 0) {
    return uVar11;
  }
  pLVar1 = &state->info_raw;
  lodepng_info_init(&info);
  lodepng_info_copy(&info,&state->info_png);
  if ((state->encoder).auto_convert == 0) {
    uVar11 = state->error;
  }
  else {
    uVar11 = lodepng_auto_choose_color(&info.color,image,w,h,pLVar1);
    state->error = uVar11;
  }
  settings = &state->encoder;
  if (uVar11 == 0) {
    iVar12 = lodepng_color_mode_equal(pLVar1,&info.color);
    if (iVar12 == 0) {
      uVar11 = lodepng_get_bpp(&info.color);
      lVar24 = (ulong)uVar11 * (ulong)(h * w);
      puVar14 = (uchar *)malloc(lVar24 + 7U >> 3);
      if (lVar24 == 0 || puVar14 != (uchar *)0x0) {
        uVar11 = lodepng_convert(puVar14,image,&info.color,pLVar1,w,h);
        state->error = uVar11;
        if (uVar11 == 0) {
          preProcessScanlines(&data,&datasize,puVar14,w,h,&info,settings);
        }
      }
      else {
        state->error = 0x53;
      }
      free(puVar14);
    }
    else {
      preProcessScanlines(&data,&datasize,image,w,h,&info,settings);
    }
  }
  outv.allocsize = 0;
  outv.data = (uchar *)0x0;
  outv.size = 0;
  if (state->error != 0) goto LAB_001174e4;
  ucvector_push_back(&outv,0x89);
  ucvector_push_back(&outv,'P');
  ucvector_push_back(&outv,'N');
  ucvector_push_back(&outv,'G');
  ucvector_push_back(&outv,'\r');
  ucvector_push_back(&outv,'\n');
  ucvector_push_back(&outv,'\x1a');
  ucvector_push_back(&outv,'\n');
  uVar17 = (uchar)info.color.colortype;
  bKGD.data = (uchar *)0x0;
  bKGD.size = 0;
  bKGD.allocsize = 0;
  lodepng_add32bitInt(&bKGD,w);
  lodepng_add32bitInt(&bKGD,h);
  ucvector_push_back(&bKGD,(uchar)info.color.bitdepth);
  ucvector_push_back(&bKGD,uVar17);
  ucvector_push_back(&bKGD,'\0');
  ucvector_push_back(&bKGD,'\0');
  ucvector_push_back(&bKGD,(uchar)info.interlace_method);
  addChunk(&outv,"IHDR",bKGD.data,bKGD.size);
  ucvector_cleanup(&bKGD);
  if (info.unknown_chunks_data[0] != (uchar *)0x0) {
    uVar11 = addUnknownChunks(&outv,info.unknown_chunks_data[0],info.unknown_chunks_size[0]);
    state->error = uVar11;
    if (uVar11 != 0) goto LAB_001174e4;
  }
  pLVar1 = &info.color;
  if (info.color.colortype == LCT_PALETTE) {
    addChunk_PLTE(&outv,pLVar1);
  }
  if (((state->encoder).force_palette != 0) && ((info.color.colortype & ~LCT_GREY_ALPHA) == LCT_RGB)
     ) {
    addChunk_PLTE(&outv,pLVar1);
  }
  LVar13 = info.color.colortype;
  if (info.color.colortype == LCT_PALETTE) {
    bVar8 = false;
    uVar17 = '\0';
    uVar18 = '\0';
    uVar19 = '\0';
    for (sVar20 = 0; sVar20 != info.color.palettesize; sVar20 = sVar20 + 1) {
      lVar24 = sVar20 * 4;
      uVar2 = info.color.palette[sVar20 * 4 + 3];
      bVar9 = true;
      if (bVar8) {
        if ((uVar2 != 0xff) ||
           (((bVar8 = bVar9, uVar17 == info.color.palette[lVar24] &&
             (uVar18 == info.color.palette[lVar24 + 1])) &&
            (uVar19 == info.color.palette[lVar24 + 2])))) goto LAB_0011773b;
      }
      else {
        bVar8 = false;
        if (uVar2 != 0xff) {
          if (uVar2 != '\0') goto LAB_0011773b;
          uVar17 = info.color.palette[lVar24];
          uVar18 = info.color.palette[lVar24 + 1];
          uVar19 = info.color.palette[lVar24 + 2];
          sVar20 = 0xffffffffffffffff;
          bVar8 = bVar9;
        }
      }
    }
    if (bVar8) {
LAB_0011773b:
      addChunk_tRNS(&outv,pLVar1);
      LVar13 = info.color.colortype;
    }
    else {
      LVar13 = LCT_PALETTE;
    }
  }
  if (((LVar13 & ~LCT_RGB) == LCT_GREY) && (info.color.key_defined != 0)) {
    addChunk_tRNS(&outv,pLVar1);
  }
  if (info.background_defined != 0) {
    bKGD.data = (uchar *)0x0;
    bKGD.size = 0;
    bKGD.allocsize = 0;
    sVar20 = 0;
    puVar14 = (uchar *)0x0;
    if (info.color.colortype < 7) {
      puVar22 = &info.background_r;
      switch(info.color.colortype) {
      default:
        info.background_b._1_1_ = info.background_r._1_1_;
        break;
      case 1:
      case 5:
        goto switchD_001177bb_caseD_1;
      case LCT_RGB:
      case LCT_RGBA:
        puVar22 = &info.background_b;
        ucvector_push_back(&bKGD,info.background_r._1_1_);
        info.background_g._0_2_ = info.background_g._1_2_;
        ucvector_push_back(&bKGD,(uchar)(undefined2)info.background_r);
        ucvector_push_back(&bKGD,(uchar)((ushort)(undefined2)info.background_g >> 8));
        ucvector_push_back(&bKGD,(uchar)(undefined2)info.background_g);
        break;
      case LCT_PALETTE:
        goto switchD_001177bb_caseD_3;
      }
      ucvector_push_back(&bKGD,info.background_b._1_1_);
switchD_001177bb_caseD_3:
      ucvector_push_back(&bKGD,(uchar)*puVar22);
      sVar20 = bKGD.size;
      puVar14 = bKGD.data;
    }
switchD_001177bb_caseD_1:
    addChunk(&outv,"bKGD",puVar14,sVar20);
    ucvector_cleanup(&bKGD);
  }
  if (info.phys_defined != 0) {
    bKGD.data = (uchar *)0x0;
    bKGD.size = 0;
    bKGD.allocsize = 0;
    lodepng_add32bitInt(&bKGD,info.phys_x);
    lodepng_add32bitInt(&bKGD,info.phys_y);
    ucvector_push_back(&bKGD,(uchar)info.phys_unit);
    addChunk(&outv,"pHYs",bKGD.data,bKGD.size);
    ucvector_cleanup(&bKGD);
  }
  if (info.unknown_chunks_data[1] != (uchar *)0x0) {
    uVar11 = addUnknownChunks(&outv,info.unknown_chunks_data[1],info.unknown_chunks_size[1]);
    state->error = uVar11;
    if (uVar11 != 0) goto LAB_001174e4;
  }
  bKGD.data = (uchar *)0x0;
  bKGD.size = 0;
  bKGD.allocsize = 0;
  uVar11 = zlib_compress(&bKGD.data,&bKGD.size,data,datasize,&settings->zlibsettings);
  if (uVar11 == 0) {
    uVar11 = addChunk(&outv,"IDAT",bKGD.data,bKGD.size);
  }
  ucvector_cleanup(&bKGD);
  state->error = uVar11;
  if (uVar11 == 0) {
    if ((info.time_defined != 0) && (puVar14 = (uchar *)malloc(7), puVar14 != (uchar *)0x0)) {
      uVar25 = (ushort)info.time.month & 0xff;
      uVar26 = (ushort)info.time.day & 0xff;
      uVar27 = (ushort)info.time.hour & 0xff;
      *puVar14 = (uchar)(info.time.year >> 8);
      bVar4 = ((info.time.year & 0xff) != 0) * (((ushort)info.time.year & 0xff) < 0x100) *
              (char)info.time.year - (0xff < ((ushort)info.time.year & 0xff));
      bVar5 = (uVar25 != 0) * (uVar25 < 0x100) * (char)(ushort)info.time.month - (0xff < uVar25);
      bVar6 = (uVar26 != 0) * (uVar26 < 0x100) * (char)(ushort)info.time.day - (0xff < uVar26);
      bVar7 = (uVar27 != 0) * (uVar27 < 0x100) * (char)(ushort)info.time.hour - (0xff < uVar27);
      *(uint *)(puVar14 + 1) =
           CONCAT13((bVar7 != 0) * (bVar7 < 0x100) * bVar7 - (0xff < bVar7),
                    CONCAT12((bVar6 != 0) * (bVar6 < 0x100) * bVar6 - (0xff < bVar6),
                             CONCAT11((bVar5 != 0) * (bVar5 < 0x100) * bVar5 - (0xff < bVar5),
                                      (bVar4 != 0) * (bVar4 < 0x100) * bVar4 - (0xff < bVar4))));
      puVar14[5] = (uchar)info.time.minute;
      puVar14[6] = (uchar)info.time.second;
      addChunk(&outv,"tIME",puVar14,7);
      free(puVar14);
    }
    ppcVar10 = info.text_keys;
    local_1d8 = info.text_num;
    for (sVar20 = 0; sVar20 != info.text_num; sVar20 = sVar20 + 1) {
      pcVar3 = ppcVar10[sVar20];
      sVar15 = strlen(pcVar3);
      if (0x4f < sVar15) {
        uVar11 = 0x42;
LAB_00117b89:
        state->error = uVar11;
        sVar20 = local_1d8;
        break;
      }
      if (sVar15 == 0) {
        uVar11 = 0x43;
        goto LAB_00117b89;
      }
      puVar14 = (uchar *)info.text_strings[sVar20];
      if ((state->encoder).text_compression == 0) {
        addChunk_tEXt(&outv,pcVar3,(char *)puVar14);
      }
      else {
        local_148 = puVar14;
        local_150 = strlen((char *)puVar14);
        bKGD.data = (uchar *)0x0;
        bKGD.size = 0;
        bKGD.allocsize = 0;
        local_168 = (undefined1  [16])0x0;
        local_158 = 0;
        for (uVar23 = 0xffffffffffffffb0; pcVar3[uVar23 + 0x50] != '\0'; uVar23 = uVar23 + 1) {
          ucvector_push_back(&bKGD,pcVar3[uVar23 + 0x50]);
        }
        if (0xffffffffffffffb0 < uVar23) {
          ucvector_push_back(&bKGD,'\0');
          ucvector_push_back(&bKGD,'\0');
          uVar11 = zlib_compress((uchar **)local_168,(size_t *)(local_168 + 8),local_148,local_150,
                                 &settings->zlibsettings);
          if (uVar11 == 0) {
            for (lVar24 = 0; lVar24 != local_168._8_8_; lVar24 = lVar24 + 1) {
              ucvector_push_back(&bKGD,*(uchar *)(local_168._0_8_ + lVar24));
            }
            addChunk(&outv,"zTXt",bKGD.data,bKGD.size);
          }
          ucvector_cleanup(local_168);
          ucvector_cleanup(&bKGD);
        }
      }
    }
    local_1d8 = sVar20;
    if ((state->encoder).add_id != 0) {
      sVar20 = 0;
      do {
        if (local_1d8 == sVar20) {
          addChunk_tEXt(&outv,"LodePNG",LODEPNG_VERSION_STRING);
          break;
        }
        iVar12 = strcmp(info.text_keys[sVar20],"LodePNG");
        sVar20 = sVar20 + 1;
      } while (iVar12 != 0);
    }
    local_150 = info.itext_num;
    local_120 = info.itext_keys;
    local_128 = info.itext_langtags;
    local_130 = info.itext_transkeys;
    local_138 = info.itext_strings;
    for (sVar15 = 0; sVar15 != local_150; sVar15 = sVar15 + 1) {
      pcVar3 = local_120[sVar15];
      sVar16 = strlen(pcVar3);
      if (0x4f < sVar16) {
        uVar11 = 0x42;
LAB_00117e39:
        state->error = uVar11;
        break;
      }
      if (sVar16 == 0) {
        uVar11 = 0x43;
        goto LAB_00117e39;
      }
      uVar11 = (state->encoder).text_compression;
      puVar14 = (uchar *)local_128[sVar15];
      puVar21 = (uchar *)local_130[sVar15];
      in = (uchar *)local_138[sVar15];
      local_148 = (uchar *)strlen((char *)in);
      bKGD.data = (uchar *)0x0;
      bKGD.size = 0;
      bKGD.allocsize = 0;
      for (uVar23 = 0xffffffffffffffb0; uVar17 = pcVar3[uVar23 + 0x50], uVar17 != '\0';
          uVar23 = uVar23 + 1) {
        ucvector_push_back(&bKGD,uVar17);
      }
      if (0xffffffffffffffb0 < uVar23) {
        ucvector_push_back(&bKGD,'\0');
        ucvector_push_back(&bKGD,uVar11 != 0);
        ucvector_push_back(&bKGD,'\0');
        for (; *puVar14 != '\0'; puVar14 = puVar14 + 1) {
          ucvector_push_back(&bKGD,*puVar14);
        }
        ucvector_push_back(&bKGD,'\0');
        for (; *puVar21 != '\0'; puVar21 = puVar21 + 1) {
          ucvector_push_back(&bKGD,*puVar21);
        }
        ucvector_push_back(&bKGD,'\0');
        if (uVar11 == 0) {
          for (; *in != '\0'; in = in + 1) {
            ucvector_push_back(&bKGD,*in);
          }
LAB_00117e03:
          addChunk(&outv,"iTXt",bKGD.data,bKGD.size);
        }
        else {
          local_168 = (undefined1  [16])0x0;
          local_158 = 0;
          uVar11 = zlib_compress((uchar **)local_168,(size_t *)(local_168 + 8),in,(size_t)local_148,
                                 &settings->zlibsettings);
          if (uVar11 == 0) {
            for (lVar24 = 0; lVar24 != local_168._8_8_; lVar24 = lVar24 + 1) {
              ucvector_push_back(&bKGD,*(uchar *)(local_168._0_8_ + lVar24));
            }
            ucvector_cleanup(local_168);
            goto LAB_00117e03;
          }
          ucvector_cleanup(local_168);
        }
        ucvector_cleanup(&bKGD);
      }
    }
    if (info.unknown_chunks_data[2] != (uchar *)0x0) {
      uVar11 = addUnknownChunks(&outv,info.unknown_chunks_data[2],info.unknown_chunks_size[2]);
      state->error = uVar11;
      if (uVar11 != 0) goto LAB_001174e4;
    }
    addChunk(&outv,"IEND",(uchar *)0x0,0);
  }
LAB_001174e4:
  lodepng_info_cleanup(&info);
  free(data);
  *out = outv.data;
  *outsize = outv.size;
  return state->error;
}

Assistant:

unsigned lodepng_encode(unsigned char** out, size_t* outsize,
                        const unsigned char* image, unsigned w, unsigned h,
                        LodePNGState* state)
{
  LodePNGInfo info;
  ucvector outv;
  unsigned char* data = 0; /*uncompressed version of the IDAT chunk data*/
  size_t datasize = 0;

  /*provide some proper output values if error will happen*/
  *out = 0;
  *outsize = 0;
  state->error = 0;

  /*check input values validity*/
  if((state->info_png.color.colortype == LCT_PALETTE || state->encoder.force_palette)
      && (state->info_png.color.palettesize == 0 || state->info_png.color.palettesize > 256))
  {
    CERROR_RETURN_ERROR(state->error, 68); /*invalid palette size, it is only allowed to be 1-256*/
  }
  if(state->encoder.zlibsettings.btype > 2)
  {
    CERROR_RETURN_ERROR(state->error, 61); /*error: unexisting btype*/
  }
  if(state->info_png.interlace_method > 1)
  {
    CERROR_RETURN_ERROR(state->error, 71); /*error: unexisting interlace mode*/
  }
  state->error = checkColorValidity(state->info_png.color.colortype, state->info_png.color.bitdepth);
  if(state->error) return state->error; /*error: unexisting color type given*/
  state->error = checkColorValidity(state->info_raw.colortype, state->info_raw.bitdepth);
  if(state->error) return state->error; /*error: unexisting color type given*/

  /* color convert and compute scanline filter types */
  lodepng_info_init(&info);
  lodepng_info_copy(&info, &state->info_png);
  if(state->encoder.auto_convert)
  {
    state->error = lodepng_auto_choose_color(&info.color, image, w, h, &state->info_raw);
  }
  if (!state->error)
  {
    if(!lodepng_color_mode_equal(&state->info_raw, &info.color))
    {
      unsigned char* converted;
      size_t size = (w * h * (size_t)lodepng_get_bpp(&info.color) + 7) / 8;

      converted = (unsigned char*)lodepng_malloc(size);
      if(!converted && size) state->error = 83; /*alloc fail*/
      if(!state->error)
      {
        state->error = lodepng_convert(converted, image, &info.color, &state->info_raw, w, h);
      }
      if(!state->error) preProcessScanlines(&data, &datasize, converted, w, h, &info, &state->encoder);
      lodepng_free(converted);
    }
    else preProcessScanlines(&data, &datasize, image, w, h, &info, &state->encoder);
  }

  /* output all PNG chunks */
  ucvector_init(&outv);
  while(!state->error) /*while only executed once, to break on error*/
  {
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    size_t i;
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*write signature and chunks*/
    writeSignature(&outv);
    /*IHDR*/
    addChunk_IHDR(&outv, w, h, info.color.colortype, info.color.bitdepth, info.interlace_method);
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*unknown chunks between IHDR and PLTE*/
    if(info.unknown_chunks_data[0])
    {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[0], info.unknown_chunks_size[0]);
      if(state->error) break;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*PLTE*/
    if(info.color.colortype == LCT_PALETTE)
    {
      addChunk_PLTE(&outv, &info.color);
    }
    if(state->encoder.force_palette && (info.color.colortype == LCT_RGB || info.color.colortype == LCT_RGBA))
    {
      addChunk_PLTE(&outv, &info.color);
    }
    /*tRNS*/
    if(info.color.colortype == LCT_PALETTE && getPaletteTranslucency(info.color.palette, info.color.palettesize) != 0)
    {
      addChunk_tRNS(&outv, &info.color);
    }
    if((info.color.colortype == LCT_GREY || info.color.colortype == LCT_RGB) && info.color.key_defined)
    {
      addChunk_tRNS(&outv, &info.color);
    }
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*bKGD (must come between PLTE and the IDAt chunks*/
    if(info.background_defined) addChunk_bKGD(&outv, &info);
    /*pHYs (must come before the IDAT chunks)*/
    if(info.phys_defined) addChunk_pHYs(&outv, &info);

    /*unknown chunks between PLTE and IDAT*/
    if(info.unknown_chunks_data[1])
    {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[1], info.unknown_chunks_size[1]);
      if(state->error) break;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*IDAT (multiple IDAT chunks must be consecutive)*/
    state->error = addChunk_IDAT(&outv, data, datasize, &state->encoder.zlibsettings);
    if(state->error) break;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*tIME*/
    if(info.time_defined) addChunk_tIME(&outv, &info.time);
    /*tEXt and/or zTXt*/
    for(i = 0; i != info.text_num; ++i)
    {
      if(strlen(info.text_keys[i]) > 79)
      {
        state->error = 66; /*text chunk too large*/
        break;
      }
      if(strlen(info.text_keys[i]) < 1)
      {
        state->error = 67; /*text chunk too small*/
        break;
      }
      if(state->encoder.text_compression)
      {
        addChunk_zTXt(&outv, info.text_keys[i], info.text_strings[i], &state->encoder.zlibsettings);
      }
      else
      {
        addChunk_tEXt(&outv, info.text_keys[i], info.text_strings[i]);
      }
    }
    /*LodePNG version id in text chunk*/
    if(state->encoder.add_id)
    {
      unsigned alread_added_id_text = 0;
      for(i = 0; i != info.text_num; ++i)
      {
        if(!strcmp(info.text_keys[i], "LodePNG"))
        {
          alread_added_id_text = 1;
          break;
        }
      }
      if(alread_added_id_text == 0)
      {
        addChunk_tEXt(&outv, "LodePNG", LODEPNG_VERSION_STRING); /*it's shorter as tEXt than as zTXt chunk*/
      }
    }
    /*iTXt*/
    for(i = 0; i != info.itext_num; ++i)
    {
      if(strlen(info.itext_keys[i]) > 79)
      {
        state->error = 66; /*text chunk too large*/
        break;
      }
      if(strlen(info.itext_keys[i]) < 1)
      {
        state->error = 67; /*text chunk too small*/
        break;
      }
      addChunk_iTXt(&outv, state->encoder.text_compression,
                    info.itext_keys[i], info.itext_langtags[i], info.itext_transkeys[i], info.itext_strings[i],
                    &state->encoder.zlibsettings);
    }

    /*unknown chunks between IDAT and IEND*/
    if(info.unknown_chunks_data[2])
    {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[2], info.unknown_chunks_size[2]);
      if(state->error) break;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    addChunk_IEND(&outv);

    break; /*this isn't really a while loop; no error happened so break out now!*/
  }

  lodepng_info_cleanup(&info);
  lodepng_free(data);
  /*instead of cleaning the vector up, give it to the output*/
  *out = outv.data;
  *outsize = outv.size;

  return state->error;
}